

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall
QRhiGles2::enqueueSubresUpload
          (QRhiGles2 *this,QGles2Texture *texD,QGles2CommandBuffer *cbD,int layer,int level,
          QRhiTextureSubresourceUploadDescription *subresDesc)

{
  Command *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *piVar5;
  QImageData *pQVar6;
  QGles2CommandBuffer *pQVar7;
  bool bVar8;
  bool bVar9;
  GLenum GVar10;
  uint uVar11;
  int iVar12;
  Format format;
  uint uVar13;
  quint32 qVar14;
  ulong uVar15;
  Command *pCVar16;
  QSize QVar17;
  uchar *puVar18;
  qsizetype bytesPerLine;
  qsizetype qVar19;
  void *pvVar20;
  QSize QVar21;
  uint uVar22;
  Representation RVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  Representation RVar27;
  QPoint QVar28;
  QGles2Texture *pQVar29;
  long in_FS_OFFSET;
  quint32 byteSize;
  GLenum effectiveTarget;
  bool isArray;
  bool is1D;
  bool is3D;
  QImage local_128;
  char *local_110;
  QImage local_100;
  undefined1 local_e8 [16];
  QImageData *local_d8;
  anon_class_80_10_ff4bedf3 local_c8;
  QByteArray local_78;
  QPoint local_60;
  float local_58;
  bool local_53;
  bool local_52;
  bool local_51;
  float local_50;
  uint local_4c;
  QGles2CommandBuffer *local_48;
  QGles2Texture *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (float)level;
  local_4c = layer;
  local_48 = cbD;
  local_40 = texD;
  trackedImageBarrier(this,cbD,texD,AccessUpdate);
  bVar8 = QRhiImplementation::isCompressedFormat
                    (&this->super_QRhiImplementation,(texD->super_QRhiTexture).m_format);
  uVar11 = (texD->super_QRhiTexture).m_flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
           super_QFlagsStorage<QRhiTexture::Flag>.i;
  local_51 = (bool)((byte)(uVar11 >> 10) & 1);
  local_52 = (bool)((byte)(uVar11 >> 0xd) & 1);
  local_53 = (bool)((byte)(uVar11 >> 0xc) & 1);
  GVar10 = 0x8515;
  if ((uVar11 & 4) == 0) {
    GVar10 = texD->target;
    layer = 0;
  }
  local_58 = (float)(layer + GVar10);
  local_60 = subresDesc->m_destinationTopLeft;
  local_78.d.d = (subresDesc->m_data).d.d;
  local_78.d.ptr = (subresDesc->m_data).d.ptr;
  local_78.d.size = (subresDesc->m_data).d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.texD = &local_40;
  local_c8.cbD = &local_48;
  local_c8.effectiveTarget = (GLenum *)&local_58;
  local_c8.level = (int *)&local_50;
  local_c8.dp = &local_60;
  local_c8.is1D = &local_52;
  local_c8.isArray = &local_53;
  local_c8.layer = (int *)&local_4c;
  local_c8.is3D = &local_51;
  local_c8.this = this;
  QImage::QImage(&local_128,&subresDesc->m_image);
  bVar9 = QImage::isNull(&local_128);
  QImage::~QImage(&local_128);
  if (bVar9) {
    if (bVar8 && local_78.d.size != 0) {
      uVar26 = (local_40->super_QRhiTexture).m_depth;
      uVar22 = (local_40->super_QRhiTexture).m_arraySize;
      uVar24 = 1;
      if (1 < (int)uVar26) {
        uVar24 = uVar26;
      }
      uVar26 = 0;
      if (0 < (int)uVar22) {
        uVar26 = uVar22;
      }
      if ((((((local_40->super_QRhiTexture).m_flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
              super_QFlagsStorage<QRhiTexture::Flag>.i & 0x100) != 0) || (local_51 != false)) ||
          (local_53 == true)) && (local_40->zeroInitialized == false)) {
        local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
        QRhiImplementation::compressedFormatInfo
                  (&this->super_QRhiImplementation,(local_40->super_QRhiTexture).m_format,
                   &(local_40->super_QRhiTexture).m_pixelSize,(quint32 *)0x0,(quint32 *)local_e8,
                   (QSize *)0x0);
        uVar11 = local_e8._0_4_;
        if (local_51 == true) {
          uVar11 = local_e8._0_4_ * uVar24;
          local_e8._0_4_ = uVar11;
        }
        if (local_53 == true) {
          uVar11 = uVar11 * uVar26;
          local_e8._0_4_ = uVar11;
        }
        local_128.d._0_4_ = 0xaaaaaaaa;
        local_128.d._4_4_ = 0xaaaaaaaa;
        local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
        local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
        local_128.super_QPaintDevice.painters = 0xaaaa;
        local_128.super_QPaintDevice._10_2_ = 0xaaaa;
        local_128.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&local_128,(ulong)uVar11,'\0');
        pQVar7 = local_48;
        iVar25 = (local_48->commands).p;
        if (iVar25 == (local_48->commands).a) {
          uVar15 = (long)iVar25 + 0x400;
          (local_48->commands).a = (int)uVar15;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar15;
          uVar15 = 0xffffffffffffffff;
          if (SUB168(auVar2 * ZEXT816(0x68),8) == 0) {
            uVar15 = SUB168(auVar2 * ZEXT816(0x68),0);
          }
          pCVar16 = (Command *)operator_new__(uVar15);
          pCVar1 = (pQVar7->commands).v;
          if (pCVar1 != (Command *)0x0) {
            memcpy(pCVar16,pCVar1,(long)iVar25 * 0x68);
            operator_delete__(pCVar1);
            iVar25 = (pQVar7->commands).p;
          }
          (pQVar7->commands).v = pCVar16;
        }
        else {
          pCVar16 = (local_48->commands).v;
        }
        (pQVar7->commands).p = iVar25 + 1;
        pCVar16[iVar25].cmd = CompressedImage;
        pCVar16[iVar25].args.beginFrame.timestampQuery = local_40->target;
        pCVar16[iVar25].args.viewport.y = *(float *)&(local_40->super_QRhiTexture).field_0x64;
        pCVar16[iVar25].args.viewport.w = local_58;
        pCVar16[iVar25].args.scissor.h = (int)local_50;
        pCVar16[iVar25].args.viewport.d0 = (float)local_40->glintformat;
        pCVar16[iVar25].args.viewport.d1 = (float)(local_40->super_QRhiTexture).m_pixelSize.wd.m_i;
        uVar22 = uVar26;
        uVar13 = uVar26;
        if ((local_52 & local_53) == 0) {
          uVar13 = 0;
          if ((local_53 & 1U) != 0) {
            uVar13 = uVar26;
          }
          uVar22 = (local_40->super_QRhiTexture).m_pixelSize.ht.m_i;
          if (local_52 != false) {
            uVar13 = 0;
          }
        }
        pCVar16[iVar25].args.drawIndexed.baseVertex = uVar22;
        if (local_51 != false) {
          uVar13 = uVar24;
        }
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[0] = uVar13;
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[1] = local_e8._0_4_;
        pvVar20 = QGles2CommandBuffer::retainData(local_48,(QByteArray *)&local_128);
        pCVar16[iVar25].args.compressedImage.data = pvVar20;
        local_40->zeroInitialized = true;
        piVar5 = (int *)CONCAT44(local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_,
                                 local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       CONCAT44(local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_,
                                local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_),1,0x10);
          }
        }
      }
      QVar21 = subresDesc->m_sourceSize;
      RVar23 = QVar21.ht.m_i;
      if (RVar23.m_i < 1 || QVar21.wd.m_i.m_i < 1) {
        QVar21 = QRhi::sizeForMipLevel((int)local_50,&(local_40->super_QRhiTexture).m_pixelSize);
        RVar23 = QVar21.ht.m_i;
      }
      pQVar29 = local_40;
      pQVar7 = local_48;
      if ((local_40->specified == false) && (local_40->zeroInitialized != true)) {
        iVar25 = (local_48->commands).p;
        if (iVar25 == (local_48->commands).a) {
          uVar15 = (long)iVar25 + 0x400;
          (local_48->commands).a = (int)uVar15;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar15;
          uVar15 = 0xffffffffffffffff;
          if (SUB168(auVar4 * ZEXT816(0x68),8) == 0) {
            uVar15 = SUB168(auVar4 * ZEXT816(0x68),0);
          }
          pCVar16 = (Command *)operator_new__(uVar15);
          pCVar1 = (pQVar7->commands).v;
          if (pCVar1 != (Command *)0x0) {
            memcpy(pCVar16,pCVar1,(long)iVar25 * 0x68);
            operator_delete__(pCVar1);
            iVar25 = (pQVar7->commands).p;
            pQVar29 = local_40;
          }
          (pQVar7->commands).v = pCVar16;
        }
        else {
          pCVar16 = (local_48->commands).v;
        }
        (pQVar7->commands).p = iVar25 + 1;
        pCVar16[iVar25].cmd = CompressedImage;
        pCVar16[iVar25].args.beginFrame.timestampQuery = pQVar29->target;
        pCVar16[iVar25].args.viewport.y = *(float *)&(pQVar29->super_QRhiTexture).field_0x64;
        pCVar16[iVar25].args.viewport.w = local_58;
        pCVar16[iVar25].args.viewport.h = local_50;
        pCVar16[iVar25].args.viewport.d0 = (float)local_40->glintformat;
        pCVar16[iVar25].args.draw.baseInstance = QVar21.wd.m_i.m_i;
        uVar22 = RVar23.m_i;
        if ((local_53 & 1U) != 0) {
          uVar22 = uVar26;
        }
        if (local_52 == false) {
          uVar22 = RVar23.m_i;
        }
        pCVar16[iVar25].args.drawIndexed.baseVertex = uVar22;
        uVar22 = 0;
        if ((local_53 & 1U) != 0) {
          uVar22 = uVar26;
        }
        if (local_51 != false) {
          uVar22 = uVar24;
        }
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[0] = uVar22;
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[1] = (uint)local_78.d.size;
        pvVar20 = QGles2CommandBuffer::retainData(local_48,&local_78);
        pCVar16[iVar25].args.compressedImage.data = pvVar20;
      }
      else {
        iVar25 = (local_48->commands).p;
        if (iVar25 == (local_48->commands).a) {
          uVar15 = (long)iVar25 + 0x400;
          (local_48->commands).a = (int)uVar15;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar15;
          uVar15 = 0xffffffffffffffff;
          if (SUB168(auVar3 * ZEXT816(0x68),8) == 0) {
            uVar15 = SUB168(auVar3 * ZEXT816(0x68),0);
          }
          pCVar16 = (Command *)operator_new__(uVar15);
          pCVar1 = (pQVar7->commands).v;
          if (pCVar1 != (Command *)0x0) {
            memcpy(pCVar16,pCVar1,(long)iVar25 * 0x68);
            operator_delete__(pCVar1);
            iVar25 = (pQVar7->commands).p;
            pQVar29 = local_40;
          }
          (pQVar7->commands).v = pCVar16;
        }
        else {
          pCVar16 = (local_48->commands).v;
        }
        (pQVar7->commands).p = iVar25 + 1;
        pCVar16[iVar25].cmd = CompressedSubImage;
        pCVar16[iVar25].args.beginFrame.timestampQuery = pQVar29->target;
        pCVar16[iVar25].args.viewport.y = *(float *)&(pQVar29->super_QRhiTexture).field_0x64;
        pCVar16[iVar25].args.viewport.w = local_58;
        pCVar16[iVar25].args.viewport.h = local_50;
        pCVar16[iVar25].args.bindVertexBuffer.binding = local_60.xp.m_i;
        if ((local_52 != true) || (RVar27.m_i = local_4c, local_53 != true)) {
          RVar27.m_i = local_60.yp.m_i;
        }
        pCVar16[iVar25].args.draw.baseInstance = RVar27.m_i;
        if ((local_51 != false) || (qVar14 = 0, local_53 == true)) {
          qVar14 = local_4c;
        }
        pCVar16[iVar25].args.drawIndexed.baseVertex = qVar14;
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[0] = QVar21.wd.m_i.m_i;
        pCVar16[iVar25].args.subImage.h = RVar23.m_i;
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[2] = local_40->glintformat;
        pCVar16[iVar25].args.bindShaderResources.dynamicOffsetPairs[3] = (uint)local_78.d.size;
        pvVar20 = QGles2CommandBuffer::retainData(local_48,&local_78);
        pCVar16[iVar25].args.compressedSubImage.data = pvVar20;
      }
    }
    else if (local_78.d.size == 0) {
      local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 2;
      local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0;
      local_128.super_QPaintDevice.painters = 0;
      local_128.super_QPaintDevice._10_2_ = 0;
      local_128.super_QPaintDevice._12_4_ = 0;
      local_128.d._0_4_ = 0;
      local_128.d._4_4_ = 0;
      local_110 = "default";
      QMessageLogger::warning
                ((char *)&local_128,"Invalid texture upload for %p layer=%d mip=%d",local_40,
                 (ulong)local_4c,(ulong)(uint)local_50);
    }
    else {
      QVar21 = subresDesc->m_sourceSize;
      if (QVar21.ht.m_i.m_i < 1 || QVar21.wd.m_i.m_i < 1) {
        QVar21 = QRhi::sizeForMipLevel((int)local_50,&(local_40->super_QRhiTexture).m_pixelSize);
      }
      pvVar20 = QGles2CommandBuffer::retainData(local_48,&local_78);
      enqueueSubresUpload::anon_class_80_10_ff4bedf3::operator()
                (&local_c8,pvVar20,QVar21,subresDesc->m_dataStride);
    }
    goto LAB_00569b00;
  }
  local_d8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_e8,&subresDesc->m_image);
  QVar17 = QImage::size((QImage *)local_e8);
  QVar21 = subresDesc->m_sourceSize;
  uVar15 = (ulong)QVar21 >> 0x20;
  if (QVar21.ht.m_i < 1 || QVar21.wd.m_i < 1) {
    uVar15 = (ulong)QVar17 >> 0x20;
    QVar28 = subresDesc->m_sourceTopLeft;
    QVar21 = (QSize)((ulong)QVar17 & 0xffffffff);
    RVar23 = QVar17.wd.m_i;
    if (QVar28 != (QPoint)0x0) goto LAB_00569523;
  }
  else {
    QVar28 = subresDesc->m_sourceTopLeft;
LAB_00569523:
    RVar23 = QVar21.wd.m_i;
    RVar27 = QVar28.xp.m_i;
    if (((this->caps).field_0x3d & 4) == 0) {
      local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = QVar28.yp.m_i;
      local_128.super_QPaintDevice._8_4_ = RVar23.m_i + RVar27.m_i + -1;
      local_128.super_QPaintDevice._12_4_ =
           (int)uVar15 + -1 + local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_;
      local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = RVar27.m_i;
      QImage::copy(&local_100,(EVP_PKEY_CTX *)local_e8,(EVP_PKEY_CTX *)&local_128);
      local_128.d._0_4_ = 0xaaaaaaaa;
      local_128.d._4_4_ = 0xaaaaaaaa;
      local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
      local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
      local_128.super_QPaintDevice.painters = 0xaaaa;
      local_128.super_QPaintDevice._10_2_ = 0xaaaa;
      local_128.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
      QPaintDevice::QPaintDevice(&local_128.super_QPaintDevice);
      pQVar6 = local_d8;
      local_d8 = local_100.d;
      local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0x7d1ec8;
      local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0;
      local_100.d = (QImageData *)0x0;
      local_128.d._0_4_ = SUB84(pQVar6,0);
      local_128.d._4_4_ = (undefined4)((ulong)pQVar6 >> 0x20);
      QImage::~QImage(&local_128);
    }
    else {
      QGles2CommandBuffer::retainImage(local_48,(QImage *)local_e8);
      puVar18 = QImage::constBits((QImage *)local_e8);
      qVar19 = QImage::bytesPerLine((QImage *)local_e8);
      iVar12 = QImage::depth((QImage *)local_e8);
      iVar25 = iVar12 + 7;
      if (-1 < iVar12) {
        iVar25 = iVar12;
      }
      iVar12 = 1;
      if (1 < iVar25 >> 3) {
        iVar12 = iVar25 >> 3;
      }
      bytesPerLine = QImage::bytesPerLine((QImage *)local_e8);
      format = QImage::format((QImage *)local_e8);
      QImage::QImage(&local_100,
                     puVar18 + (long)(iVar12 * RVar27.m_i) + ((long)QVar28 >> 0x20) * qVar19,
                     RVar23.m_i,(int)uVar15,bytesPerLine,format,(QImageCleanupFunction)0x0,
                     (void *)0x0);
      local_128.d._0_4_ = 0xaaaaaaaa;
      local_128.d._4_4_ = 0xaaaaaaaa;
      local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
      local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
      local_128.super_QPaintDevice.painters = 0xaaaa;
      local_128.super_QPaintDevice._10_2_ = 0xaaaa;
      local_128.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
      QPaintDevice::QPaintDevice(&local_128.super_QPaintDevice);
      pQVar6 = local_d8;
      local_d8 = local_100.d;
      local_128.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0x7d1ec8;
      local_128.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0;
      local_100.d = (QImageData *)0x0;
      local_128.d._0_4_ = SUB84(pQVar6,0);
      local_128.d._4_4_ = (undefined4)((ulong)pQVar6 >> 0x20);
      QImage::~QImage(&local_128);
    }
    QImage::~QImage(&local_100);
  }
  pvVar20 = QGles2CommandBuffer::retainImage(local_48,(QImage *)local_e8);
  qVar19 = QImage::bytesPerLine((QImage *)local_e8);
  enqueueSubresUpload::anon_class_80_10_ff4bedf3::operator()
            (&local_c8,pvVar20,(QSize)((ulong)(uint)RVar23.m_i | uVar15 << 0x20),(quint32)qVar19);
  QImage::~QImage((QImage *)local_e8);
LAB_00569b00:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::enqueueSubresUpload(QGles2Texture *texD, QGles2CommandBuffer *cbD,
                                    int layer, int level, const QRhiTextureSubresourceUploadDescription &subresDesc)
{
    trackedImageBarrier(cbD, texD, QGles2Texture::AccessUpdate);
    const bool isCompressed = isCompressedFormat(texD->m_format);
    const bool isCubeMap = texD->m_flags.testFlag(QRhiTexture::CubeMap);
    const bool is3D = texD->m_flags.testFlag(QRhiTexture::ThreeDimensional);
    const bool is1D = texD->m_flags.testFlag(QRhiTexture::OneDimensional);
    const bool isArray = texD->m_flags.testFlag(QRhiTexture::TextureArray);
    const GLenum faceTargetBase = isCubeMap ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : texD->target;
    const GLenum effectiveTarget = faceTargetBase + (isCubeMap ? uint(layer) : 0u);
    const QPoint dp = subresDesc.destinationTopLeft();
    const QByteArray rawData = subresDesc.data();

    auto setCmdByNotCompressedData = [&](const void* data, QSize size, quint32 dataStride)
    {
        quint32 bytesPerLine = 0;
        quint32 bytesPerPixel = 0;
        textureFormatInfo(texD->m_format, size, &bytesPerLine, nullptr, &bytesPerPixel);

        QGles2CommandBuffer::Command &cmd(cbD->commands.get());
        cmd.cmd = QGles2CommandBuffer::Command::SubImage;
        cmd.args.subImage.target = texD->target;
        cmd.args.subImage.texture = texD->texture;
        cmd.args.subImage.faceTarget = effectiveTarget;
        cmd.args.subImage.level = level;
        cmd.args.subImage.dx = dp.x();
        cmd.args.subImage.dy = is1D && isArray ? layer : dp.y();
        cmd.args.subImage.dz = is3D || isArray ? layer : 0;
        cmd.args.subImage.w = size.width();
        cmd.args.subImage.h = size.height();
        cmd.args.subImage.glformat = texD->glformat;
        cmd.args.subImage.gltype = texD->gltype;

        if (dataStride == 0)
            dataStride = bytesPerLine;

        cmd.args.subImage.rowStartAlign = (dataStride & 3) ? 1 : 4;
        cmd.args.subImage.rowLength = caps.unpackRowLength ? (bytesPerPixel ? dataStride / bytesPerPixel : 0) : 0;

        cmd.args.subImage.data = data;
    };

    if (!subresDesc.image().isNull()) {
        QImage img = subresDesc.image();
        QSize size = img.size();
        if (!subresDesc.sourceSize().isEmpty() || !subresDesc.sourceTopLeft().isNull()) {
            const QPoint sp = subresDesc.sourceTopLeft();
            if (!subresDesc.sourceSize().isEmpty())
                size = subresDesc.sourceSize();

            if (caps.unpackRowLength) {
                cbD->retainImage(img);
                // create a non-owning wrapper for the subimage
                const uchar *data = img.constBits() + sp.y() * img.bytesPerLine() + sp.x() * (qMax(1, img.depth() / 8));
                img = QImage(data, size.width(), size.height(), img.bytesPerLine(), img.format());
            } else {
                img = img.copy(sp.x(), sp.y(), size.width(), size.height());
            }
        }

        setCmdByNotCompressedData(cbD->retainImage(img), size, img.bytesPerLine());
    } else if (!rawData.isEmpty() && isCompressed) {
        const int depth = qMax(1, texD->m_depth);
        const int arraySize = qMax(0, texD->m_arraySize);
        if ((texD->flags().testFlag(QRhiTexture::UsedAsCompressedAtlas) || is3D || isArray)
                && !texD->zeroInitialized)
        {
            // Create on first upload since glCompressedTexImage2D cannot take
            // nullptr data. We have a rule in the QRhi docs that the first
            // upload for a compressed texture must cover the entire image, but
            // that is clearly not ideal when building a texture atlas, or when
            // having a 3D texture with per-slice data.
            quint32 byteSize = 0;
            compressedFormatInfo(texD->m_format, texD->m_pixelSize, nullptr, &byteSize, nullptr);
            if (is3D)
                byteSize *= depth;
            if (isArray)
                byteSize *= arraySize;
            QByteArray zeroBuf(byteSize, 0);
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedImage;
            cmd.args.compressedImage.target = texD->target;
            cmd.args.compressedImage.texture = texD->texture;
            cmd.args.compressedImage.faceTarget = effectiveTarget;
            cmd.args.compressedImage.level = level;
            cmd.args.compressedImage.glintformat = texD->glintformat;
            cmd.args.compressedImage.w = texD->m_pixelSize.width();
            cmd.args.compressedImage.h = is1D && isArray ? arraySize : texD->m_pixelSize.height();
            cmd.args.compressedImage.depth = is3D ? depth : (isArray ? arraySize : 0);
            cmd.args.compressedImage.size = byteSize;
            cmd.args.compressedImage.data = cbD->retainData(zeroBuf);
            texD->zeroInitialized = true;
        }

        const QSize size = subresDesc.sourceSize().isEmpty() ? q->sizeForMipLevel(level, texD->m_pixelSize)
                                                             : subresDesc.sourceSize();
        if (texD->specified || texD->zeroInitialized) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedSubImage;
            cmd.args.compressedSubImage.target = texD->target;
            cmd.args.compressedSubImage.texture = texD->texture;
            cmd.args.compressedSubImage.faceTarget = effectiveTarget;
            cmd.args.compressedSubImage.level = level;
            cmd.args.compressedSubImage.dx = dp.x();
            cmd.args.compressedSubImage.dy = is1D && isArray ? layer : dp.y();
            cmd.args.compressedSubImage.dz = is3D || isArray ? layer : 0;
            cmd.args.compressedSubImage.w = size.width();
            cmd.args.compressedSubImage.h = size.height();
            cmd.args.compressedSubImage.glintformat = texD->glintformat;
            cmd.args.compressedSubImage.size = rawData.size();
            cmd.args.compressedSubImage.data = cbD->retainData(rawData);
        } else {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedImage;
            cmd.args.compressedImage.target = texD->target;
            cmd.args.compressedImage.texture = texD->texture;
            cmd.args.compressedImage.faceTarget = effectiveTarget;
            cmd.args.compressedImage.level = level;
            cmd.args.compressedImage.glintformat = texD->glintformat;
            cmd.args.compressedImage.w = size.width();
            cmd.args.compressedImage.h = is1D && isArray ? arraySize : size.height();
            cmd.args.compressedImage.depth = is3D ? depth : (isArray ? arraySize : 0);
            cmd.args.compressedImage.size = rawData.size();
            cmd.args.compressedImage.data = cbD->retainData(rawData);
        }
    } else if (!rawData.isEmpty()) {
        const QSize size = subresDesc.sourceSize().isEmpty() ? q->sizeForMipLevel(level, texD->m_pixelSize)
                                                             : subresDesc.sourceSize();

        setCmdByNotCompressedData(cbD->retainData(rawData), size, subresDesc.dataStride());
    } else {
        qWarning("Invalid texture upload for %p layer=%d mip=%d", texD, layer, level);
    }
}